

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbscurve.cpp
# Opt level: O3

bool __thiscall ON_NurbsCurve::RemoveSpan(ON_NurbsCurve *this,int span_index)

{
  double dVar1;
  double dVar2;
  double dVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  double *pdVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  char *sFormat;
  size_t __n;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  ulong uVar21;
  double *__src;
  double *pdVar22;
  double *pdVar23;
  uint uVar24;
  ulong uVar25;
  long lVar26;
  ulong uVar27;
  double dVar28;
  
  iVar9 = this->m_dim;
  uVar12 = (iVar9 + 1) - (uint)(this->m_is_rat == 0);
  uVar15 = 0;
  if (0 < iVar9) {
    uVar15 = uVar12;
  }
  iVar19 = this->m_order;
  if (1 < iVar19) {
    iVar5 = this->m_cv_count;
    if ((((0 < iVar9 && iVar19 <= iVar5) && ((int)uVar12 <= this->m_cv_stride)) &&
        (pdVar11 = this->m_knot, pdVar11 != (double *)0x0)) && (this->m_cv != (double *)0x0)) {
      if (span_index <= iVar5 - iVar19 && -1 < span_index) {
        if (iVar5 == iVar19) {
          sFormat = "Cannot remove the only span from a Bezier NURBS curve.";
          iVar9 = 0x1069;
          goto LAB_005414a2;
        }
        __n = (ulong)uVar12 << 3;
        dVar1 = pdVar11[(ulong)(uint)(iVar19 + span_index) - 2];
        dVar2 = pdVar11[(ulong)(uint)(iVar19 + span_index) - 1];
        dVar28 = (double)(-(ulong)(dVar1 < dVar2) & (ulong)(dVar2 - dVar1));
        iVar5 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x35])
                          (this);
        iVar9 = this->m_order;
        iVar19 = this->m_cv_count;
        uVar12 = iVar19 - iVar9;
        if (span_index == 0) {
          uVar25 = 1;
          if (1 < (int)uVar12) {
            uVar25 = 1;
            do {
              dVar3 = this->m_knot[(long)iVar9 + (uVar25 - 1)];
              pdVar11 = this->m_knot + (long)iVar9 + (uVar25 - 2);
              if (*pdVar11 <= dVar3 && dVar3 != *pdVar11) goto LAB_00541617;
              uVar25 = uVar25 + 1;
            } while (uVar12 != uVar25);
            uVar25 = (ulong)uVar12;
          }
LAB_00541617:
          iVar6 = (int)uVar25;
          if (iVar6 < iVar19) {
            iVar9 = 0;
            do {
              pdVar23 = this->m_cv;
              pdVar11 = pdVar23 + this->m_cv_stride * iVar9;
              if (pdVar23 == (double *)0x0) {
                pdVar11 = (double *)0x0;
              }
              pdVar22 = pdVar23 + this->m_cv_stride * (iVar6 + iVar9);
              if (pdVar23 == (double *)0x0) {
                pdVar22 = (double *)0x0;
              }
              memcpy(pdVar11,pdVar22,__n);
              iVar19 = this->m_cv_count;
              iVar13 = iVar6 + iVar9;
              iVar9 = iVar9 + 1;
            } while (iVar13 + 1 < iVar19);
            iVar9 = this->m_order;
          }
          if (iVar6 < iVar19 + iVar9 + -2) {
            pdVar11 = this->m_knot;
            uVar21 = 0;
            do {
              dVar3 = pdVar11[(uVar25 & 0xffffffff) + uVar21];
              uVar27 = -(ulong)(dVar2 == dVar3);
              pdVar11[uVar21] = (double)(uVar27 & (ulong)dVar1 | ~uVar27 & (ulong)(dVar3 - dVar28));
              uVar21 = uVar21 + 1;
            } while (((iVar9 + iVar19) - iVar6) - 2 != uVar21);
          }
          iVar6 = iVar19 - iVar6;
        }
        else if (span_index < (int)uVar12) {
          uVar12 = (iVar9 + span_index) - 2;
          uVar24 = (iVar9 + span_index) - 1;
          pdVar11 = this->m_knot;
          uVar25 = (ulong)uVar12;
          if (2 < iVar9 + span_index) {
            uVar25 = (ulong)uVar12;
            pdVar23 = pdVar11 + uVar25;
            uVar17 = uVar24;
            do {
              if (pdVar11[uVar25 - 1] <= *pdVar23 && *pdVar23 != pdVar11[uVar25 - 1])
              goto LAB_0054158f;
              uVar25 = uVar25 - 1;
              uVar17 = uVar17 - 1;
            } while (1 < (int)uVar17);
            uVar25 = 0;
          }
LAB_0054158f:
          uVar18 = (iVar19 + iVar9) - 3;
          lVar10 = (long)(int)uVar24;
          lVar26 = lVar10;
          uVar17 = uVar18;
          if ((int)uVar18 < (int)uVar24) {
            uVar17 = uVar24;
          }
          do {
            uVar16 = uVar17;
            if ((int)uVar18 <= lVar26) break;
            lVar4 = lVar26 + 1;
            uVar12 = uVar12 + 1;
            lVar26 = lVar26 + 1;
            uVar16 = uVar12;
          } while (pdVar11[lVar4] < pdVar11[lVar10] || pdVar11[lVar4] == pdVar11[lVar10]);
          uVar12 = (uint)uVar25;
          iVar19 = (uVar16 - uVar12) + 1;
          if ((dVar28 <= 0.0) &&
             (((pdVar11[(int)uVar12] != pdVar11[(int)uVar16] ||
               (NAN(pdVar11[(int)uVar12]) || NAN(pdVar11[(int)uVar16]))) || (iVar19 < iVar9)))) {
            sFormat = "span_index parameter identifies an empty span.";
            iVar9 = 0x10aa;
            goto LAB_005414a2;
          }
          iVar6 = iVar9 + -1;
          uVar17 = uVar12 - iVar6;
          if (((int)uVar17 < 0) || (iVar6 <= (int)(iVar9 + span_index + ~uVar12))) {
            pdVar11 = (double *)0x0;
            iVar13 = iVar9;
          }
          else {
            pdVar11 = (double *)onmalloc((long)(int)((uVar15 + 2) * iVar9) * 8 - 0x10);
            iVar6 = this->m_order;
            memcpy(pdVar11 + (long)(int)uVar15 * (long)iVar6,this->m_knot + uVar17,
                   (long)iVar6 * 0x10 - 0x10);
            iVar13 = this->m_order;
            if (0 < iVar13) {
              lVar26 = 0;
              pdVar23 = pdVar11;
              do {
                pdVar22 = this->m_cv + (long)(int)(uVar17 + (int)lVar26) * (long)this->m_cv_stride;
                if (this->m_cv == (double *)0x0) {
                  pdVar22 = (double *)0x0;
                }
                memcpy(pdVar23,pdVar22,__n);
                lVar26 = lVar26 + 1;
                iVar13 = this->m_order;
                pdVar23 = pdVar23 + uVar15;
              } while (lVar26 < iVar13);
            }
            ON_ClampKnotVector(uVar15,iVar13,iVar13,uVar15,pdVar11,
                               pdVar11 + (long)(int)uVar15 * (long)iVar6,1);
            iVar6 = this->m_order + -1;
            iVar13 = this->m_order;
          }
          iVar7 = iVar6 - iVar19;
          if (iVar7 != 0 && iVar19 <= iVar6) {
            ReserveCVCapacity(this,(this->m_cv_count + iVar7) * this->m_cv_stride);
            ReserveKnotCapacity(this,this->m_order + this->m_cv_count + iVar7 + -2);
            iVar13 = this->m_order;
            iVar8 = this->m_cv_count;
            iVar20 = iVar8 + iVar13 + -3;
            iVar14 = (uVar16 + 2) - iVar13;
            if (iVar14 <= iVar20) {
              pdVar23 = this->m_knot;
              lVar26 = (long)iVar20 + 1;
              do {
                pdVar23[(long)iVar7 + lVar26 + -1] = pdVar23[lVar26 + -1];
                lVar26 = lVar26 + -1;
              } while (iVar14 < lVar26);
            }
            if (iVar14 < iVar8) {
              do {
                iVar14 = iVar8 + -1;
                pdVar22 = this->m_cv;
                pdVar23 = pdVar22 + (int)((iVar8 + ((iVar6 + uVar12) - uVar16) + -2) *
                                         this->m_cv_stride);
                if (pdVar22 == (double *)0x0) {
                  pdVar23 = (double *)0x0;
                }
                __src = pdVar22 + this->m_cv_stride * iVar14;
                if (pdVar22 == (double *)0x0) {
                  __src = (double *)0x0;
                }
                memcpy(pdVar23,__src,__n);
                iVar13 = this->m_order;
                iVar8 = iVar14;
              } while ((int)((uVar16 + 2) - iVar13) < iVar14);
              iVar8 = this->m_cv_count;
            }
            uVar16 = uVar16 + iVar7;
            uVar24 = uVar24 + iVar7;
            this->m_cv_count = iVar8 + iVar7;
          }
          if ((int)(uVar16 - uVar24) < iVar13 + -2) {
            ON_ClampKnotVector(uVar15,iVar13,iVar13,this->m_cv_stride,
                               this->m_cv + (int)(((uVar16 - iVar13) + 2) * this->m_cv_stride),
                               this->m_knot + (long)(int)(uVar16 - iVar13) + 2,0);
            iVar13 = this->m_order;
          }
          uVar24 = (uVar16 - iVar13) + 2;
          if (pdVar11 != (double *)0x0) {
            if (1 < iVar13) {
              lVar26 = 0;
              pdVar23 = pdVar11;
              do {
                pdVar22 = this->m_cv +
                          (long)(int)((uVar12 - iVar9) + 1 + (int)lVar26) * (long)this->m_cv_stride;
                if (this->m_cv == (double *)0x0) {
                  pdVar22 = (double *)0x0;
                }
                memcpy(pdVar22,pdVar23,__n);
                lVar26 = lVar26 + 1;
                pdVar23 = pdVar23 + uVar15;
              } while (lVar26 < (long)this->m_order + -1);
            }
            onfree(pdVar11);
          }
          if ((int)uVar24 <= (int)uVar12) {
            if (((0.0 < dVar28) && (uVar12 == uVar24)) &&
               (iVar9 = this->m_cv_count + this->m_order + -2, (int)uVar12 < iVar9)) {
              pdVar11 = this->m_knot;
              lVar26 = (long)(int)uVar12;
              do {
                dVar3 = pdVar11[lVar26];
                uVar25 = -(ulong)(dVar2 == dVar3);
                pdVar11[lVar26] =
                     (double)(uVar25 & (ulong)dVar1 | ~uVar25 & (ulong)(dVar3 - dVar28));
                lVar26 = lVar26 + 1;
              } while (iVar9 != lVar26);
            }
            goto LAB_00541bfa;
          }
          iVar9 = this->m_cv_count;
          if ((int)uVar24 < iVar9) {
            if (iVar19 < iVar6) {
              iVar19 = iVar6;
            }
            iVar19 = (iVar19 - iVar13) + 1;
            uVar15 = uVar12;
            do {
              pdVar23 = this->m_cv;
              pdVar11 = pdVar23 + (int)(this->m_cv_stride * uVar15);
              if (pdVar23 == (double *)0x0) {
                pdVar11 = (double *)0x0;
              }
              pdVar22 = pdVar23 + (int)(this->m_cv_stride * (iVar19 + uVar15));
              if (pdVar23 == (double *)0x0) {
                pdVar22 = (double *)0x0;
              }
              memcpy(pdVar11,pdVar22,__n);
              iVar9 = this->m_cv_count;
              iVar6 = uVar15 + iVar19;
              uVar15 = uVar15 + 1;
            } while (iVar6 + 1 < iVar9);
          }
          iVar19 = this->m_order + iVar9 + -2;
          if ((int)uVar24 < iVar19) {
            pdVar11 = this->m_knot;
            lVar26 = 0;
            do {
              dVar3 = pdVar11[(int)uVar24 + lVar26];
              uVar25 = -(ulong)(dVar2 == dVar3);
              pdVar11[(int)uVar12 + lVar26] =
                   (double)(uVar25 & (ulong)dVar1 | ~uVar25 & (ulong)(dVar3 - dVar28));
              lVar26 = lVar26 + 1;
            } while (lVar26 < (long)iVar19 - (long)(int)uVar24);
          }
          iVar6 = iVar9 + (uVar12 - (uVar16 - iVar13)) + -2;
        }
        else {
          lVar26 = (long)(int)uVar12;
          uVar15 = 1;
          if ((int)uVar12 < 1) {
            uVar15 = uVar12;
          }
          iVar6 = uVar15 - 1;
          pdVar11 = this->m_knot + (long)iVar19 + -2;
          do {
            if (lVar26 < 2) goto LAB_00541711;
            lVar26 = lVar26 + -1;
            dVar1 = *pdVar11;
            pdVar23 = pdVar11 + -1;
            pdVar11 = pdVar11 + -1;
          } while (dVar1 < *pdVar23 || dVar1 == *pdVar23);
          iVar6 = (int)lVar26;
LAB_00541711:
          iVar6 = iVar6 + iVar9;
        }
        this->m_cv_count = iVar6;
LAB_00541bfa:
        if (((char)iVar5 != '\0') &&
           (iVar9 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x35]
                    )(this), (char)iVar9 != '\0')) {
          return true;
        }
        ClampEnd(this,2);
        return true;
      }
      sFormat = "span_index parameter is out of range.";
      iVar9 = 0x1063;
      goto LAB_005414a2;
    }
  }
  sFormat = "Invalid NURBS curve.";
  iVar9 = 0x105d;
LAB_005414a2:
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_nurbscurve.cpp"
             ,iVar9,"",sFormat);
  return false;
}

Assistant:

bool ON_NurbsCurve::RemoveSpan(
  int span_index 
  )
{
  const int cv_size = CVSize();
  if (    m_order < 2 
       || m_cv_count < m_order
       || m_dim <= 0
       || cv_size > m_cv_stride 
       || 0 == m_knot
       || 0 == m_cv
       )
  {
    ON_ERROR("Invalid NURBS curve.");
    return false;
  }

  if ( span_index < 0 || span_index > m_cv_count-m_order )
  {
    ON_ERROR("span_index parameter is out of range.");
    return false;
  }

  if ( m_cv_count == m_order )
  {
    ON_ERROR("Cannot remove the only span from a Bezier NURBS curve.");
    return false;
  }

  const size_t sizeof_cv = cv_size*sizeof(m_cv[0]);
  int i, j;

  const double knot0 = m_knot[span_index+m_order-2];
  const double knot1 = m_knot[span_index+m_order-1];
  const double knot_delta = (knot0 < knot1) ? (knot1 - knot0) : 0.0;

  const bool bIsPeriodic0 = IsPeriodic()?true:false;

  if ( span_index <= 0 )
  {
    // remove initial span
    // set span_index = index of the span to keep.
    for ( span_index = 1; span_index < m_cv_count-m_order; span_index++ )
    {
      if ( m_knot[span_index+m_order-2] < m_knot[span_index+m_order-1] )
        break;
    }
    for ( i = 0; i+span_index < m_cv_count; i++ )
      memcpy(CV(i),CV(i+span_index),sizeof_cv);
    for ( i = 0; i+span_index < m_cv_count+m_order-2; i++ )
    {
      m_knot[i] = (knot1 == m_knot[i+span_index])
                ? knot0
                : (m_knot[i+span_index] - knot_delta);
    }
    m_cv_count -= span_index;
  }
  else if ( span_index >= m_cv_count-m_order )
  {
    // remove final span
    // set span_index = index of the span to keep.
    for ( span_index = m_cv_count-m_order-1; span_index > 0; span_index-- )
    {
      if ( m_knot[span_index+m_order-2] < m_knot[span_index+m_order-1] )
        break;
    }
    m_cv_count = span_index+m_order;
  }
  else
  {
    // remove interior span
    int k0 = span_index+m_order-2;
    int k1 = span_index+m_order-1;
    int i0 = k0;
    int i1 = k1;
    for ( i0 = k0; i0 > 0; i0-- )
    {
      if ( m_knot[i0-1] < m_knot[k0] )
        break;
    }
    for ( i1 = k1; i1 < m_cv_count+m_order-3; i1++ )
    {
      if ( m_knot[i1+1] > m_knot[k1] )
        break;
    }
    int m = (i1-i0+1);
    if ( !(knot_delta > 0.0) )
    {
      if ( !(m_knot[i0] == m_knot[i1]) || m < m_order )
      {
        ON_ERROR("span_index parameter identifies an empty span.");
        return false;
      }
    }

    int span_index0 = i0 - (m_order-1);
    double* cv0 = 0;
    if ( span_index0 >= 0 && k0 - i0 + 1 < m_order-1 )
    {
      cv0 = (double*)onmalloc( (m_order*cv_size + 2*m_order-2)*sizeof(cv0[0]) );
      double* knot0_local = cv0 + (m_order*cv_size);
      memcpy( knot0_local, m_knot+span_index0, (2*m_order-2)*sizeof(knot0_local[0]) );
      for ( i = 0; i < m_order; i++ )
        memcpy( cv0 + (i*cv_size), CV(span_index0+i), sizeof_cv );
      ON_ClampKnotVector( cv_size, m_order, m_order, cv_size, cv0, knot0_local, 1 );
    }

    if ( m < m_order-1 )
    {
      i = m_order-1 - m;
      ReserveCVCapacity( m_cv_stride*(m_cv_count+i) );
      ReserveKnotCapacity( m_cv_count+m_order-2+i );
      for ( j = m_cv_count+m_order-3; j >= i1-m_order+2; j-- )
        m_knot[j+i] = m_knot[j];
      for ( j = m_cv_count-1; j >= i1-m_order+2; j-- )
        memcpy(CV(j+i),CV(j),sizeof_cv);
      i1 += i;
      k1 += i;
      m_cv_count += i;
    }

    if ( i1-k1 < m_order-2 )
      ON_ClampKnotVector( cv_size, m_order, m_order, m_cv_stride, 
                          m_cv + ((i1-m_order+2)*m_cv_stride), 
                          m_knot + (i1-m_order+2), 
                          0 );

    k0 = i0;
    k1 = i1-m_order+2;

    if ( 0 != cv0 )
    {
      for ( i = 0; i < m_order-1; i++ )
        memcpy(CV(i+span_index0),cv0 + (i*cv_size),sizeof_cv);
      onfree(cv0);
      cv0 = 0;
    }

    if ( k0 < k1 )
    {
      for ( i = 0; i + k1 < m_cv_count; i++ )
        memcpy(CV(i+k0),CV(i+k1),sizeof_cv);
      for ( i = 0; i + k1 < m_cv_count+m_order-2; i++ )
      {
        m_knot[i+k0] = (knot1 == m_knot[i+k1]) 
                     ? knot0
                     : (m_knot[i+k1] - knot_delta);
      }
      m_cv_count -= (k1-k0);
    }
    else if ( k0 == k1 && knot_delta > 0.0 )
    {
      for ( i = k0; i < m_cv_count+m_order-2; i++ )
      {
        m_knot[i] = (knot1 == m_knot[i])
                  ? knot0
                  : (m_knot[i] - knot_delta);
      }
    }
  }

  if ( false == bIsPeriodic0 || false == IsPeriodic() )
    ClampEnd(2);

  return true;
}